

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

InlinedStringField * __thiscall
google::protobuf::Reflection::GetRaw<google::protobuf::internal::InlinedStringField>
          (Reflection *this,Message *message,FieldDescriptor *field)

{
  bool bVar1;
  uint32 uVar2;
  InlinedStringField *pIVar3;
  
  if (*(long *)(field + 0x58) != 0) {
    bVar1 = HasOneofField(this,message,field);
    if (!bVar1) {
      pIVar3 = (InlinedStringField *)
               internal::ReflectionSchema::GetFieldDefault(&this->schema_,field);
      return pIVar3;
    }
  }
  uVar2 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,field);
  return (InlinedStringField *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar2);
}

Assistant:

const Type& Reflection::GetRaw(const Message& message,
                               const FieldDescriptor* field) const {
  if (field->containing_oneof() && !HasOneofField(message, field)) {
    return DefaultRaw<Type>(field);
  }
  return GetConstRefAtOffset<Type>(message, schema_.GetFieldOffset(field));
}